

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
calculator::FunctionDeclareException::FunctionDeclareException
          (FunctionDeclareException *this,string *function)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *function_local;
  FunctionDeclareException *this_local;
  
  local_18 = function;
  function_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  SyntaxError::SyntaxError(&this->super_SyntaxError,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  *(undefined ***)&this->super_SyntaxError = &PTR__FunctionDeclareException_00136788;
  std::operator+(&local_90,"Error: function [",local_18);
  std::operator+(&local_70,&local_90,"] unexpected ( ");
  std::__cxx11::string::operator=
            ((string *)&(this->super_SyntaxError).error_msg,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

FunctionDeclareException(const std::string& function) {
        error_msg = "Error: function [" + function + "] unexpected ( ";
    }